

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  long lVar1;
  pointer pcVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer puVar7;
  ulong uVar8;
  pointer puVar9;
  size_t totalsize;
  size_t sVar10;
  ulong uVar11;
  size_t __n;
  ulong __new_size;
  anon_union_4_2_77b30072 flag_struct;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  void *ptr;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  uint local_4a8;
  uint local_4a4;
  size_t local_4a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_498;
  pointer local_478;
  pointer puStack_470;
  undefined8 local_468;
  undefined4 local_460;
  long *local_458;
  undefined4 local_450;
  int local_44c;
  undefined8 local_448;
  size_t local_440;
  vector<signed_char,_std::allocator<signed_char>_> local_438;
  undefined4 local_420;
  long *local_418;
  undefined4 local_410;
  int local_40c;
  undefined8 local_408;
  size_t local_400;
  
  if (type == 1) {
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
    local_420 = 1;
    local_418 = (long *)0x0;
    local_410 = 1;
    local_408 = 0x100000001;
    sVar10 = (size_t)w;
    local_400 = sVar10;
    if (w == 0) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->elempack = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar10;
      local_40c = w;
    }
    else {
      local_478 = (pointer)0x0;
      local_40c = w;
      iVar5 = posix_memalign(&local_478,0x10,sVar10 * 4 + 4);
      puVar9 = (pointer)0x0;
      if (iVar5 == 0) {
        puVar9 = local_478;
      }
      puVar7 = puVar9 + sVar10 * 2;
      puVar7[0] = 1;
      puVar7[1] = 0;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar9;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar7;
      iVar5 = (*this->dr->_vptr_DataReader[3])(this->dr,local_478,sVar10 * 4);
      if (CONCAT44(extraout_var_01,iVar5) == sVar10 * 4) {
        __return_storage_ptr__->data = puVar9;
        __return_storage_ptr__->refcount = (int *)puVar7;
        __return_storage_ptr__->elemsize = 4;
        __return_storage_ptr__->elempack = 1;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 1;
        __return_storage_ptr__->w = w;
        __return_storage_ptr__->h = 1;
        __return_storage_ptr__->c = 1;
        __return_storage_ptr__->cstep = sVar10;
        LOCK();
        *(int *)(puVar9 + sVar10 * 2) = *(int *)(puVar9 + sVar10 * 2) + 1;
        UNLOCK();
      }
      else {
        load();
      }
    }
    if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish == (pointer)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
         *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish != 0) {
      return __return_storage_ptr__;
    }
    puVar9 = (pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    if (local_418 != (long *)0x0) {
      (**(code **)(*local_418 + 0x18))();
      return __return_storage_ptr__;
    }
    goto LAB_0012aef5;
  }
  if (type != 0) {
    load();
    return __return_storage_ptr__;
  }
  iVar5 = (*this->dr->_vptr_DataReader[3])(this->dr,&local_4a8,4);
  if (CONCAT44(extraout_var,iVar5) != 4) {
    load();
    return __return_storage_ptr__;
  }
  if (local_4a8 == 0x2c056) {
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
    local_420 = 1;
    local_418 = (long *)0x0;
    local_410 = 1;
    local_408 = 0x100000001;
    sVar10 = (size_t)w;
    local_400 = sVar10;
    if (w == 0) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->elempack = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar10;
      local_40c = w;
    }
    else {
      local_478 = (pointer)0x0;
      local_40c = w;
      iVar5 = posix_memalign(&local_478,0x10,sVar10 * 4 + 4);
      puVar9 = (pointer)0x0;
      if (iVar5 == 0) {
        puVar9 = local_478;
      }
      puVar7 = puVar9 + sVar10 * 2;
      puVar7[0] = 1;
      puVar7[1] = 0;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar9;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar7;
      iVar5 = (*this->dr->_vptr_DataReader[3])(this->dr,local_478,sVar10 * 4);
      if (CONCAT44(extraout_var_03,iVar5) == sVar10 * 4) {
        __return_storage_ptr__->data = puVar9;
        __return_storage_ptr__->refcount = (int *)puVar7;
        __return_storage_ptr__->elemsize = 4;
        __return_storage_ptr__->elempack = 1;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 1;
        __return_storage_ptr__->w = w;
        __return_storage_ptr__->h = 1;
        __return_storage_ptr__->c = 1;
        __return_storage_ptr__->cstep = sVar10;
        LOCK();
        *(int *)(puVar9 + sVar10 * 2) = *(int *)(puVar9 + sVar10 * 2) + 1;
        UNLOCK();
      }
      else {
        load();
      }
    }
    if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish == (pointer)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
         *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish != 0) {
      return __return_storage_ptr__;
    }
    puVar9 = (pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    if (local_418 != (long *)0x0) {
      (**(code **)(*local_418 + 0x18))();
      return __return_storage_ptr__;
    }
    goto LAB_0012aef5;
  }
  if (local_4a8 == 0xd4b38) {
    __n = (size_t)w;
    uVar11 = __n + 3 & 0xfffffffffffffffc;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(&local_438,uVar11);
    iVar5 = (*this->dr->_vptr_DataReader[3])
                      (this->dr,local_438.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,uVar11);
    if (CONCAT44(extraout_var_02,iVar5) == uVar11) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 1;
      __return_storage_ptr__->elempack = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = __n;
      if (w != 0) {
        local_478 = (pointer)0x0;
        iVar5 = posix_memalign(&local_478,0x10,uVar11 + 4);
        puVar9 = (pointer)0x0;
        if (iVar5 == 0) {
          puVar9 = local_478;
        }
        __return_storage_ptr__->data = puVar9;
        __return_storage_ptr__->refcount = (int *)((long)puVar9 + uVar11);
        pcVar2 = (pointer)((long)puVar9 + uVar11);
        pcVar2[0] = '\x01';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0) {
          memcpy(local_478,
                 local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start,__n);
        }
      }
    }
    else {
      load();
    }
LAB_0012aa7a:
    if ((unsigned_short *)
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start == (unsigned_short *)0x0) {
      return __return_storage_ptr__;
    }
    operator_delete(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    return __return_storage_ptr__;
  }
  local_440 = (size_t)w;
  if (local_4a8 == 0x1306b47) {
    uVar11 = local_440 * 2 + 3 & 0xfffffffffffffffc;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_438,uVar11);
    iVar5 = (*this->dr->_vptr_DataReader[3])
                      (this->dr,local_438.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,uVar11);
    if (CONCAT44(extraout_var_00,iVar5) == uVar11) {
      Mat::from_float16(__return_storage_ptr__,
                        (unsigned_short *)
                        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,w);
    }
    else {
      load();
    }
    goto LAB_0012aa7a;
  }
  uVar3 = local_4a8 >> 8;
  uVar4 = local_4a8 >> 0x10;
  local_478 = (pointer)0x0;
  puStack_470 = (pointer)0x0;
  local_468 = 4;
  local_460 = 1;
  local_458 = (long *)0x0;
  local_450 = 1;
  local_448 = 0x100000001;
  local_44c = w;
  if (w == 0) {
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->elemsize = 4;
    __return_storage_ptr__->elempack = 1;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 1;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 1;
    __return_storage_ptr__->c = 1;
    __return_storage_ptr__->cstep = local_440;
  }
  else {
    uVar6 = local_4a8 & 0xff;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4a4 = local_4a8 >> 0x18;
    local_4a0 = local_440;
    iVar5 = posix_memalign((void **)&local_438,0x10,local_440 * 4 + 4);
    sVar10 = local_4a0;
    puVar9 = (pointer)0x0;
    if (iVar5 == 0) {
      puVar9 = (pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    }
    puVar7 = puVar9 + local_4a0 * 2;
    puVar7[0] = 1;
    puVar7[1] = 0;
    local_478 = puVar9;
    puStack_470 = puVar7;
    if ((uVar3 & 0xff) + uVar6 + (uVar4 & 0xff) == 0 && local_4a4 == 0) {
      if (((char)local_4a8 == '\0') &&
         (lVar1 = local_4a0 * 4,
         iVar5 = (*this->dr->_vptr_DataReader[3])
                           (this->dr,local_438.
                                     super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                     _M_impl.super__Vector_impl_data._M_start,lVar1),
         CONCAT44(extraout_var_06,iVar5) != lVar1)) {
        load();
        goto LAB_0012aecf;
      }
    }
    else {
      iVar5 = (*this->dr->_vptr_DataReader[3])(this->dr,&local_438,0x400);
      if (CONCAT44(extraout_var_04,iVar5) != 0x400) {
        load();
        goto LAB_0012aecf;
      }
      __new_size = sVar10 + 3 & 0xfffffffffffffffc;
      local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_498,__new_size);
      iVar5 = (*this->dr->_vptr_DataReader[3])
                        (this->dr,local_498.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,__new_size);
      uVar11 = CONCAT44(extraout_var_05,iVar5);
      if (uVar11 == __new_size) {
        if (w < 1) goto LAB_0012ae73;
        uVar8 = 0;
        do {
          *(undefined4 *)(puVar9 + uVar8 * 2) =
               *(undefined4 *)
                ((long)&local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                (ulong)local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar8] * 4);
          uVar8 = uVar8 + 1;
        } while ((uint)w != uVar8);
LAB_0012ae78:
        operator_delete(local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_498.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_498.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      else {
        fprintf(_stderr,"ModelBin read index_array failed %zd",uVar11);
        fputc(10,_stderr);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
LAB_0012ae73:
        if (local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0012ae78;
      }
      sVar10 = local_4a0;
      if (uVar11 != __new_size) goto LAB_0012aecf;
    }
    __return_storage_ptr__->data = puVar9;
    __return_storage_ptr__->refcount = (int *)puVar7;
    __return_storage_ptr__->elemsize = 4;
    __return_storage_ptr__->elempack = 1;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 1;
    __return_storage_ptr__->w = w;
    __return_storage_ptr__->h = 1;
    __return_storage_ptr__->c = 1;
    __return_storage_ptr__->cstep = sVar10;
    LOCK();
    *(int *)(puVar9 + sVar10 * 2) = *(int *)(puVar9 + sVar10 * 2) + 1;
    UNLOCK();
  }
LAB_0012aecf:
  if (puStack_470 == (pointer)0x0) {
    return __return_storage_ptr__;
  }
  LOCK();
  *(int *)puStack_470 = *(int *)puStack_470 + -1;
  UNLOCK();
  if (*(int *)puStack_470 != 0) {
    return __return_storage_ptr__;
  }
  puVar9 = local_478;
  if (local_458 != (long *)0x0) {
    (**(code **)(*local_458 + 0x18))();
    return __return_storage_ptr__;
  }
LAB_0012aef5:
  if (puVar9 != (pointer)0x0) {
    free(puVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = dr.read(float16_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = dr.read(int8_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        size_t nread = dr.read(m, w * sizeof(float));
        if (nread != w * sizeof(float))
        {
            NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}